

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Flags.hpp
# Opt level: O0

bool __thiscall
InstructionSet::x86::Flags::condition<(InstructionSet::x86::Condition)5>(Flags *this)

{
  bool bVar1;
  Flags *this_local;
  
  bVar1 = flag<(InstructionSet::x86::Flag)8>(this);
  return bVar1;
}

Assistant:

bool condition() const {
			switch(test) {
				case Condition::Overflow:		return flag<Flag::Overflow>();
				case Condition::Below:			return flag<Flag::Carry>();
				case Condition::Zero:			return flag<Flag::Zero>();
				case Condition::BelowOrEqual:	return flag<Flag::Zero>() || flag<Flag::Carry>();
				case Condition::Sign:			return flag<Flag::Sign>();
				case Condition::ParityOdd:		return flag<Flag::ParityOdd>();
				case Condition::Less:			return flag<Flag::Sign>() != flag<Flag::Overflow>();
				case Condition::LessOrEqual:	return flag<Flag::Zero>() || flag<Flag::Sign>() != flag<Flag::Overflow>();
			}
		}